

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::CumulativeReporterBase::SectionNode> * __thiscall
Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
          (Ptr<Catch::CumulativeReporterBase::SectionNode> *this,SectionNode *p)

{
  SectionNode *in_RDI;
  Ptr<Catch::CumulativeReporterBase::SectionNode> temp;
  Ptr<Catch::CumulativeReporterBase::SectionNode> *this_00;
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_18 [3];
  
  this_00 = local_18;
  Ptr(this_00,in_RDI);
  swap(this_00,(Ptr<Catch::CumulativeReporterBase::SectionNode> *)in_RDI);
  ~Ptr(this_00);
  return (Ptr<Catch::CumulativeReporterBase::SectionNode> *)in_RDI;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }